

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SmallVector<spvc_combined_image_sampler,_8UL> * __thiscall
spirv_cross::SmallVector<spvc_combined_image_sampler,_8UL>::operator=
          (SmallVector<spvc_combined_image_sampler,_8UL> *this,
          SmallVector<spvc_combined_image_sampler,_8UL> *other)

{
  spvc_variable_id sVar1;
  spvc_combined_image_sampler *psVar2;
  spvc_combined_image_sampler *psVar3;
  ulong local_20;
  size_t i;
  SmallVector<spvc_combined_image_sampler,_8UL> *other_local;
  SmallVector<spvc_combined_image_sampler,_8UL> *this_local;
  
  clear(this);
  psVar3 = (other->super_VectorView<spvc_combined_image_sampler>).ptr;
  psVar2 = AlignedBuffer<spvc_combined_image_sampler,_8UL>::data(&other->stack_storage);
  if (psVar3 == psVar2) {
    reserve(this,(other->super_VectorView<spvc_combined_image_sampler>).buffer_size);
    for (local_20 = 0; local_20 < (other->super_VectorView<spvc_combined_image_sampler>).buffer_size
        ; local_20 = local_20 + 1) {
      psVar3 = (this->super_VectorView<spvc_combined_image_sampler>).ptr + local_20;
      psVar2 = (other->super_VectorView<spvc_combined_image_sampler>).ptr + local_20;
      sVar1 = psVar2->image_id;
      psVar3->combined_id = psVar2->combined_id;
      psVar3->image_id = sVar1;
      psVar3->sampler_id = psVar2->sampler_id;
    }
    (this->super_VectorView<spvc_combined_image_sampler>).buffer_size =
         (other->super_VectorView<spvc_combined_image_sampler>).buffer_size;
    (other->super_VectorView<spvc_combined_image_sampler>).buffer_size = 0;
  }
  else {
    psVar3 = (this->super_VectorView<spvc_combined_image_sampler>).ptr;
    psVar2 = AlignedBuffer<spvc_combined_image_sampler,_8UL>::data(&this->stack_storage);
    if (psVar3 != psVar2) {
      free((this->super_VectorView<spvc_combined_image_sampler>).ptr);
    }
    (this->super_VectorView<spvc_combined_image_sampler>).ptr =
         (other->super_VectorView<spvc_combined_image_sampler>).ptr;
    (this->super_VectorView<spvc_combined_image_sampler>).buffer_size =
         (other->super_VectorView<spvc_combined_image_sampler>).buffer_size;
    this->buffer_capacity = other->buffer_capacity;
    (other->super_VectorView<spvc_combined_image_sampler>).ptr = (spvc_combined_image_sampler *)0x0;
    (other->super_VectorView<spvc_combined_image_sampler>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}